

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_score_test.cc
# Opt level: O0

void __thiscall xLearn::FMScoreTest_calc_score_Test::TestBody(FMScoreTest_calc_score_Test *this)

{
  uint uVar1;
  bool bVar2;
  index_t iVar3;
  index_t iVar4;
  reference pvVar5;
  real_t *prVar6;
  char *message;
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar7 [16];
  undefined1 extraout_var [56];
  undefined1 auVar8 [64];
  AssertionResult gtest_ar;
  real_t val;
  size_t i_2;
  FMScore score;
  index_t d_2;
  index_t d_1;
  index_t d;
  index_t j;
  index_t k_aligned;
  real_t *v;
  index_t i_1;
  index_t num_w;
  real_t *w;
  Model model;
  index_t i;
  SparseRow row;
  string *in_stack_000001d8;
  Model *in_stack_000001e0;
  HyperParam param;
  index_t k;
  HyperParam *in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc10;
  real_t in_stack_fffffffffffffc14;
  real_t *in_stack_fffffffffffffc18;
  index_t in_stack_fffffffffffffc20;
  uint in_stack_fffffffffffffc24;
  AssertHelper local_398;
  Message local_390;
  AssertionResult local_388;
  real_t local_374;
  ulong local_370;
  HyperParam *in_stack_fffffffffffffcb0;
  uint local_30c;
  uint local_308;
  uint local_304;
  uint local_300;
  real_t *local_2f8;
  uint local_2f0;
  Model local_2e0;
  uint local_250;
  vector<xLearn::Node,_std::allocator<xLearn::Node>_> local_248 [2];
  string local_218 [32];
  string local_1f8 [108];
  undefined4 local_18c;
  undefined4 local_188;
  uint local_168;
  uint local_160;
  real_t norm;
  Model *in_stack_fffffffffffffea8;
  SparseRow *in_stack_fffffffffffffeb0;
  FMScore *in_stack_fffffffffffffeb8;
  float in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  uint local_c;
  
  for (local_c = 1; local_c < 100; local_c = local_c + 1) {
    HyperParam::HyperParam(in_stack_fffffffffffffcb0);
    local_18c = 0x3dcccccd;
    local_188 = 0;
    std::__cxx11::string::operator=(local_1f8,"squared");
    std::__cxx11::string::operator=(local_218,"fm");
    auVar8._8_56_ = extraout_var;
    auVar8._0_8_ = extraout_XMM1_Qa;
    local_168 = 3;
    local_160 = local_c;
    norm = 4.2039e-45;
    std::allocator<xLearn::Node>::allocator((allocator<xLearn::Node> *)0x13a819);
    std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::vector
              ((vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)
               CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
               (size_type)in_stack_fffffffffffffc18,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
    std::allocator<xLearn::Node>::~allocator((allocator<xLearn::Node> *)0x13a83f);
    for (local_250 = 0; uVar1 = local_250, local_250 < local_168; local_250 = local_250 + 1) {
      pvVar5 = std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::operator[]
                         (local_248,(ulong)local_250);
      pvVar5->feat_id = uVar1;
      pvVar5 = std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::operator[]
                         (local_248,(ulong)local_250);
      pvVar5->feat_val = 2.0;
    }
    Model::Model((Model *)in_stack_fffffffffffffc00);
    Model::Initialize(in_stack_000001e0,in_stack_000001d8,
                      (string *)
                      row.super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                      row.super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>._M_impl.
                      super__Vector_impl_data._M_finish._4_4_,
                      (index_t)row.super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>.
                               _M_impl.super__Vector_impl_data._M_finish,
                      row.super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>._M_impl.
                      super__Vector_impl_data._M_start._4_4_,param.score_func._0_4_,
                      row.super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>._M_impl.
                      super__Vector_impl_data._M_start._0_4_);
    prVar6 = Model::GetParameter_w(&local_2e0);
    iVar3 = Model::GetNumParameter_w(&local_2e0);
    for (local_2f0 = 0; local_2f0 < iVar3; local_2f0 = local_2f0 + 1) {
      prVar6[local_2f0] = 1.0;
    }
    local_2f8 = Model::GetParameter_v(&local_2e0);
    iVar3 = Model::get_aligned_k((Model *)0x13aa3a);
    for (local_300 = 0; iVar4 = Model::GetNumFeature(&local_2e0), local_300 < iVar4;
        local_300 = local_300 + 1) {
      local_304 = 0;
      while (in_stack_fffffffffffffc24 = local_304, iVar4 = Model::GetNumK(&local_2e0),
            in_stack_fffffffffffffc24 < iVar4) {
        *local_2f8 = 1.0;
        local_304 = local_304 + 1;
        local_2f8 = local_2f8 + 1;
      }
      in_stack_fffffffffffffc20 = Model::GetNumK(&local_2e0);
      for (local_308 = in_stack_fffffffffffffc20; local_30c = iVar3, local_308 < iVar3;
          local_308 = local_308 + 1) {
        *local_2f8 = 0.0;
        local_2f8 = local_2f8 + 1;
      }
      for (; local_30c < iVar3 << 1; local_30c = local_30c + 1) {
        *local_2f8 = 1.0;
        local_2f8 = local_2f8 + 1;
      }
    }
    in_stack_fffffffffffffc18 = Model::GetParameter_b(&local_2e0);
    *in_stack_fffffffffffffc18 = 0.0;
    FMScore::FMScore((FMScore *)in_stack_fffffffffffffc00);
    for (local_370 = 0; auVar7 = auVar8._0_16_, local_370 < 10; local_370 = local_370 + 1) {
      in_stack_fffffffffffffc14 =
           FMScore::CalcScore(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                              in_stack_fffffffffffffea8,norm);
      auVar7 = vcvtusi2ss_avx512f(auVar7,local_c * 0xc + 6);
      auVar8 = ZEXT1664(auVar7);
      local_374 = in_stack_fffffffffffffc14;
      testing::internal::CmpHelperFloatingPointEQ<float>
                (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                 in_stack_ffffffffffffffb8);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_388);
      in_stack_fffffffffffffc10 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffc10);
      if (!bVar2) {
        testing::Message::Message(&local_390);
        message = testing::AssertionResult::failure_message((AssertionResult *)0x13ad01);
        testing::internal::AssertHelper::AssertHelper
                  (&local_398,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/score/fm_score_test.cc"
                   ,0x4a,message);
        testing::internal::AssertHelper::operator=(&local_398,&local_390);
        testing::internal::AssertHelper::~AssertHelper(&local_398);
        testing::Message::~Message((Message *)0x13ad4f);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x13ad9e);
    }
    FMScore::~FMScore((FMScore *)0x13add3);
    Model::~Model((Model *)in_stack_fffffffffffffc00);
    std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::~vector
              ((vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)
               CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
    HyperParam::~HyperParam(in_stack_fffffffffffffc00);
  }
  return;
}

Assistant:

TEST(FMScoreTest, calc_score) {
  for (index_t k = 1; k < 100; ++k) {
    // Init hyper_param
    HyperParam param;
    param.learning_rate = 0.1;
    param.regu_lambda = 0;
    param.loss_func = "squared";
    param.score_func = "fm";
    param.num_feature = 3;
    param.num_K = k;
    param.num_field = 3;
    // Init SparseRow
    SparseRow row(param.num_feature);
    for (index_t i = 0; i < param.num_feature; ++i) {
      row[i].feat_id = i;
      row[i].feat_val = 2.0;
    }
    // Init model
    Model model;
    model.Initialize(param.score_func,
                param.loss_func,
                param.num_feature,
                param.num_field,
                param.num_K, 2);
    real_t* w = model.GetParameter_w();
    index_t num_w = model.GetNumParameter_w();
    for (index_t i = 0; i < num_w; ++i) {
      w[i] = 1.0;
    }
    real_t* v = model.GetParameter_v();
    index_t k_aligned = model.get_aligned_k();
    for (index_t j = 0; j < model.GetNumFeature(); ++j) {
      for(index_t d = 0; d < model.GetNumK(); d++, v++)
        *v = 1.0;
      for(index_t d = model.GetNumK(); d < k_aligned; d++, v++)
        *v = 0;
      for(index_t d = k_aligned; d < 2*k_aligned; d++, v++)
        *v = 1.0;
    }
    model.GetParameter_b()[0] = 0.0;
    FMScore score;
    for (size_t i = 0; i < 10; ++i) {
      real_t val = score.CalcScore(&row, model);
      EXPECT_FLOAT_EQ(val, 6+k*4*3);
    }
  }
}